

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void __thiscall
cubeb_passthrough_resampler_fill_input_left_Test::TestBody
          (cubeb_passthrough_resampler_fill_input_left_Test *this)

{
  long lVar1;
  char *message;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  AssertionResult gtest_ar;
  int iteration;
  long input_frame_count;
  long output_frame_count;
  long got;
  passthrough_resampler<float> resampler;
  float output [64];
  float input [96];
  internal local_320 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  Message local_310;
  undefined4 local_304;
  long local_300;
  AssertHelper local_2f8;
  long local_2f0;
  long local_2e8;
  passthrough_resampler<float> local_2e0;
  undefined1 local_298 [256];
  undefined8 local_198 [49];
  int iVar5;
  int iVar7;
  
  local_304 = 0;
  lVar1 = 0;
  passthrough_resampler<float>::passthrough_resampler
            (&local_2e0,(cubeb_stream *)0x0,passthrough_resampler_fill_input_left,&local_304,2,
             0xac44);
  local_300 = 0x30;
  local_2f0 = 0x20;
  memset(local_198,0,0x180);
  memset(local_298,0,0x100);
  uVar2 = 0x100000000;
  uVar3 = 0x300000002;
  do {
    auVar4._0_8_ = uVar3 & 0xffffffff;
    iVar5 = (int)(uVar3 >> 0x20);
    auVar4._8_4_ = iVar5;
    auVar4._12_4_ = 0;
    iVar7 = (int)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2 & 0xffffffff;
    auVar6._8_4_ = iVar7;
    auVar6._12_4_ = 0;
    *(ulong *)((long)local_198 + lVar1 * 4) =
         CONCAT44((float)((SUB168(auVar6 | _DAT_0014e160,8) - DAT_0014e160._8_8_) * 0.01),
                  (float)((SUB168(auVar6 | _DAT_0014e160,0) - (double)DAT_0014e160) * 0.01));
    *(ulong *)((long)local_198 + lVar1 * 4 + 8) =
         CONCAT44((float)((SUB168(auVar4 | _DAT_0014e160,8) - DAT_0014e160._8_8_) * 0.01),
                  (float)((SUB168(auVar4 | _DAT_0014e160,0) - (double)DAT_0014e160) * 0.01));
    lVar1 = lVar1 + 4;
    uVar2 = CONCAT44(iVar7 + 4,(int)uVar2 + 4);
    uVar3 = CONCAT44(iVar5 + 4,(int)uVar3 + 4);
  } while (lVar1 != 0x60);
  local_304 = 1;
  local_2e8 = passthrough_resampler<float>::fill(&local_2e0,local_198,&local_300,local_298,0x20);
  testing::internal::CmpHelperEQ<long,long>
            (local_320,"got","output_frame_count",&local_2e8,&local_2f0);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message(&local_310);
    if (local_318 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_318->_M_dataplus)._M_p;
    }
    iVar5 = 0x468;
  }
  else {
    if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_318,local_318);
    }
    testing::internal::CmpHelperEQ<long,long>
              (local_320,"input_frame_count","output_frame_count",&local_300,&local_2f0);
    if (local_320[0] == (internal)0x0) {
      testing::Message::Message(&local_310);
      if (local_318 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_318->_M_dataplus)._M_p;
      }
      iVar5 = 0x46a;
    }
    else {
      if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_318,local_318);
      }
      local_300 = 0x20;
      local_304 = 2;
      local_2e8 = passthrough_resampler<float>::fill(&local_2e0,local_198,&local_300,local_298,0x20)
      ;
      testing::internal::CmpHelperEQ<long,long>
                (local_320,"got","output_frame_count",&local_2e8,&local_2f0);
      if (local_320[0] == (internal)0x0) {
        testing::Message::Message(&local_310);
        if (local_318 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_318->_M_dataplus)._M_p;
        }
        iVar5 = 0x471;
      }
      else {
        if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_318,local_318);
        }
        testing::internal::CmpHelperEQ<long,long>
                  (local_320,"input_frame_count","output_frame_count",&local_300,&local_2f0);
        if (local_320[0] == (internal)0x0) {
          testing::Message::Message(&local_310);
          if (local_318 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_318->_M_dataplus)._M_p;
          }
          iVar5 = 0x473;
        }
        else {
          if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_318,local_318);
          }
          local_300 = 8;
          local_304 = 3;
          local_2e8 = passthrough_resampler<float>::fill
                                (&local_2e0,local_198,&local_300,local_298,0x20);
          testing::internal::CmpHelperEQ<long,long>
                    (local_320,"got","output_frame_count",&local_2e8,&local_2f0);
          if (local_320[0] == (internal)0x0) {
            testing::Message::Message(&local_310);
            if (local_318 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = (local_318->_M_dataplus)._M_p;
            }
            iVar5 = 0x47a;
          }
          else {
            if (local_318 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_318,local_318);
            }
            local_310.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )0x18;
            testing::internal::CmpHelperEQ<long,long>
                      (local_320,"input_frame_count","output_frame_count - 8",&local_300,
                       (long *)&local_310);
            if (local_320[0] != (internal)0x0) goto LAB_0010e23a;
            testing::Message::Message(&local_310);
            if (local_318 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = (local_318->_M_dataplus)._M_p;
            }
            iVar5 = 0x47c;
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_2f8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
             ,iVar5,message);
  testing::internal::AssertHelper::operator=(&local_2f8,&local_310);
  testing::internal::AssertHelper::~AssertHelper(&local_2f8);
  if (local_310.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_310.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0010e23a:
  if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_318,local_318);
  }
  local_2e0.super_cubeb_resampler._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b670;
  if (local_2e0.internal_input_buffer.data_ != (float *)0x0) {
    operator_delete__(local_2e0.internal_input_buffer.data_);
  }
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_input_left)
{
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  int iteration = 0;
  passthrough_resampler<float> resampler = passthrough_resampler<float>(
      nullptr, passthrough_resampler_fill_input_left, &iteration, channels,
      sample_rate);

  long input_frame_count = 48; // 32 + 16
  const long output_frame_count = 32;
  float input[96] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }

  // 1st iteration, add the extra input.
  iteration = 1;
  long got =
      resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 2st iteration, use the extra input from previous iteration,
  // 16 frames are remaining in the input buffer.
  input_frame_count = 32; // we need 16 input frames but we get more;
  iteration = 2;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 3rd iteration, use the extra input from previous iteration.
  // 16 frames are remaining in the input buffer.
  input_frame_count = 16 - 8; // We need 16 more input frames but we only get 8.
  iteration = 3;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 8);
}